

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O3

char * fy_token_list_dump_format(fy_token_list *fytl,fy_token *fyt_highlight,char *buf,size_t bufsz)

{
  int iVar1;
  fy_token *pfVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  fy_token *pfVar7;
  
  pcVar5 = buf;
  if (fytl != (fy_token_list *)0x0) {
    pfVar7 = (fy_token *)(fytl->_lh).next;
    if (pfVar7 != (fy_token *)0x0 && pfVar7 != (fy_token *)fytl) {
      do {
        pfVar2 = (fy_token *)(fytl->_lh).next;
        if (pfVar2 == (fy_token *)fytl) {
          pfVar2 = (fy_token *)0x0;
        }
        pcVar4 = "";
        if (pfVar7 != pfVar2) {
          pcVar4 = ",";
        }
        pcVar6 = "*";
        if (pfVar7 != fyt_highlight) {
          pcVar6 = "";
        }
        iVar1 = snprintf(pcVar5,(size_t)(buf + ((bufsz - 1) - (long)pcVar5)),"%s%s",pcVar4,pcVar6);
        pcVar4 = (char *)0x0;
        if ((ulong)pfVar7->type < 0x17) {
          pcVar4 = fy_token_type_txt[pfVar7->type];
        }
        pcVar6 = "<NULL>";
        if (pcVar4 != (char *)0x0) {
          pcVar6 = pcVar4;
        }
        pcVar5 = pcVar5 + iVar1;
        snprintf(pcVar5,(size_t)(buf + ((bufsz - 1) - (long)pcVar5)),"%s",pcVar6);
        sVar3 = strlen(pcVar5);
        pcVar5 = pcVar5 + sVar3;
        pfVar7 = (fy_token *)(pfVar7->node).next;
      } while ((pfVar7 != (fy_token *)fytl) && (pfVar7 != (fy_token *)0x0));
    }
  }
  *pcVar5 = '\0';
  return buf;
}

Assistant:

char *fy_token_list_dump_format(struct fy_token_list *fytl,
                                struct fy_token *fyt_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_token *fyt;

    s = buf;
    e = buf + bufsz - 1;
    for (fyt = fy_token_list_first(fytl); fyt; fyt = fy_token_next(fytl, fyt)) {

        s += snprintf(s, e - s, "%s%s",
                      fyt != fy_token_list_first(fytl) ? "," : "",
                      fyt_highlight == fyt ? "*" : "");

        fy_token_dump_format(fyt, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}